

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
GEO::AdaptiveKdTree::split_kd_node
          (AdaptiveKdTree *this,index_t b,index_t e,double *bbox_min,double *bbox_max,index_t *m,
          coord_index_t *cut_dim,double *cut_val)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  double *pdVar4;
  uint local_90;
  index_t m0;
  index_t br2;
  index_t br1;
  double coord_max;
  double coord_min;
  double ideal_cut_val;
  double spr;
  double length_1;
  double dStack_58;
  coord_index_t d_1;
  double max_spread;
  double length;
  double dStack_40;
  coord_index_t d;
  double max_length;
  double ERR;
  index_t *m_local;
  double *bbox_max_local;
  double *bbox_min_local;
  index_t e_local;
  index_t b_local;
  AdaptiveKdTree *this_local;
  
  max_length = 0.001;
  dStack_40 = -1.0;
  ERR = (double)m;
  m_local = (index_t *)bbox_max;
  bbox_max_local = bbox_min;
  bbox_min_local._0_4_ = e;
  bbox_min_local._4_4_ = b;
  _e_local = this;
  for (length._7_1_ = 0; bVar1 = length._7_1_,
      bVar2 = NearestNeighborSearch::dimension((NearestNeighborSearch *)this), bVar1 < bVar2;
      length._7_1_ = length._7_1_ + 1) {
    max_spread = *(double *)(m_local + (ulong)length._7_1_ * 2) - bbox_max_local[length._7_1_];
    pdVar4 = std::max<double>(&stack0xffffffffffffffc0,&max_spread);
    dStack_40 = *pdVar4;
  }
  *cut_dim = '\0';
  dStack_58 = -1.0;
  for (length_1._7_1_ = 0; bVar1 = length_1._7_1_,
      bVar2 = NearestNeighborSearch::dimension((NearestNeighborSearch *)this), bVar1 < bVar2;
      length_1._7_1_ = length_1._7_1_ + 1) {
    spr = *(double *)(m_local + (ulong)length_1._7_1_ * 2) - bbox_max_local[length_1._7_1_];
    if ((dStack_40 * 0.999 <= spr) &&
       (ideal_cut_val =
             KdTree::spread(&this->super_KdTree,bbox_min_local._4_4_,(index_t)bbox_min_local,
                            length_1._7_1_), dStack_58 < ideal_cut_val)) {
      *cut_dim = length_1._7_1_;
      dStack_58 = ideal_cut_val;
    }
  }
  coord_min = (bbox_max_local[*cut_dim] + *(double *)(m_local + (ulong)*cut_dim * 2)) * 0.5;
  KdTree::get_minmax(&this->super_KdTree,bbox_min_local._4_4_,(index_t)bbox_min_local,*cut_dim,
                     &coord_max,(double *)&br2);
  *cut_val = coord_min;
  if (coord_max <= coord_min) {
    if (_br2 < coord_min) {
      *cut_val = _br2;
    }
  }
  else {
    *cut_val = coord_max;
  }
  (*(this->super_KdTree).super_NearestNeighborSearch.super_Counted._vptr_Counted[0xf])
            (*cut_val,this,(ulong)bbox_min_local._4_4_,(ulong)(index_t)bbox_min_local,
             (ulong)*cut_dim,&m0,&local_90);
  uVar3 = bbox_min_local._4_4_ + ((index_t)bbox_min_local - bbox_min_local._4_4_ >> 1);
  *(uint *)ERR = uVar3;
  if (coord_max <= coord_min) {
    if (coord_min <= _br2) {
      if (uVar3 < m0) {
        *(index_t *)ERR = m0;
      }
      else if (local_90 < uVar3) {
        *(uint *)ERR = local_90;
      }
    }
    else {
      *(index_t *)ERR = (index_t)bbox_min_local - 1;
    }
  }
  else {
    *(index_t *)ERR = bbox_min_local._4_4_ + 1;
  }
  return;
}

Assistant:

void AdaptiveKdTree::split_kd_node(
        index_t b, index_t e,
	double* bbox_min, double* bbox_max,
	index_t& m, coord_index_t& cut_dim, double& cut_val	
    ) {
	// Like "sliding midpoint split" in ANN.
	
	const double ERR=0.001;
	
	// Find length of longest box size
	double max_length = -1.0;
	for(coord_index_t d=0; d<dimension(); ++d) {
	    double length = bbox_max[d] - bbox_min[d];
	    max_length = std::max(max_length, length);
	}

	// Cutting coordinate
	cut_dim=0;
	
	// Find long side with most spread
	double max_spread = -1.0;
	for(coord_index_t d=0; d<dimension(); ++d) {
	    double length = bbox_max[d] - bbox_min[d];
	    // Is it among longest ?
	    if(length >= (1.0 - ERR)*max_length) {
		double spr = spread(b, e, d);
		if(spr > max_spread) {
		    max_spread = spr;
		    cut_dim = d;
		}
	    }
	}

	double ideal_cut_val = 0.5*(bbox_min[cut_dim] + bbox_max[cut_dim]);

	double coord_min, coord_max;
	get_minmax(b, e, cut_dim, coord_min, coord_max);

	cut_val = ideal_cut_val;
	
	// Make it slide if need be.
	if(ideal_cut_val < coord_min) {
	    cut_val = coord_min;
	} else if (ideal_cut_val > coord_max) {
	    cut_val = coord_max;
	}
	
	index_t br1,br2;
	plane_split(b,e,cut_dim,cut_val,br1,br2);

	index_t m0 = b + (e-b)/2;
	m = m0;
	
	if(ideal_cut_val < coord_min) {
	    m = b+1;
	} else if(ideal_cut_val > coord_max) {
	    m = e-1;
	} else if(br1 > m0) {
	    m = br1;
	} else if(br2 < m0) {
	    m = br2;
	} 
    }